

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

uint64_t __thiscall kaitai::kstream::read_bits_int_be(kstream *this,int n)

{
  int iVar1;
  runtime_error *this_00;
  int iVar2;
  undefined4 in_register_00000034;
  ulong local_70;
  uint64_t mask;
  uint64_t new_bits;
  int i;
  uint8_t buf [8];
  int bytes_needed;
  int bits_needed;
  uint64_t res;
  int n_local;
  kstream *this_local;
  
  _bytes_needed = 0;
  iVar2 = n - this->m_bits_left;
  this->m_bits_left = -iVar2 & 7;
  if (iVar2 < 1) {
    _bytes_needed = this->m_bits >> (-(byte)iVar2 & 0x3f);
  }
  else {
    iVar1 = (iVar2 + -1) / 8 + 1;
    if (8 < iVar1) {
      this_00 = (runtime_error *)
                __cxa_allocate_exception
                          (0x10,CONCAT44(in_register_00000034,n),(long)(iVar2 + -1) % 8 & 0xffffffff
                          );
      std::runtime_error::runtime_error(this_00,"read_bits_int_be: more than 8 bytes requested");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::read((char *)this->m_io,(long)&new_bits + 4);
    for (new_bits._0_4_ = 0; (int)new_bits < iVar1; new_bits._0_4_ = (int)new_bits + 1) {
      _bytes_needed =
           _bytes_needed << 8 | (ulong)*(byte *)((long)&new_bits + (long)(int)new_bits + 4);
    }
    if (iVar2 < 0x40) {
      local_70 = this->m_bits << ((byte)iVar2 & 0x3f);
    }
    else {
      local_70 = 0;
    }
    this->m_bits = _bytes_needed;
    _bytes_needed = _bytes_needed >> ((byte)this->m_bits_left & 0x3f) | local_70;
  }
  this->m_bits = (1L << ((byte)this->m_bits_left & 0x3f)) - 1U & this->m_bits;
  return _bytes_needed;
}

Assistant:

uint64_t kaitai::kstream::read_bits_int_be(int n) {
    uint64_t res = 0;

    int bits_needed = n - m_bits_left;
    m_bits_left = -bits_needed & 7; // `-bits_needed mod 8`

    if (bits_needed > 0) {
        // 1 bit  => 1 byte
        // 8 bits => 1 byte
        // 9 bits => 2 bytes
        int bytes_needed = ((bits_needed - 1) / 8) + 1; // `ceil(bits_needed / 8)`
        if (bytes_needed > 8)
            throw std::runtime_error("read_bits_int_be: more than 8 bytes requested");
        uint8_t buf[8];
        m_io->read(reinterpret_cast<char *>(buf), bytes_needed);
        for (int i = 0; i < bytes_needed; i++) {
            res = res << 8 | buf[i];
        }

        uint64_t new_bits = res;
        res = res >> m_bits_left | (bits_needed < 64 ? m_bits << bits_needed : 0); // avoid undefined behavior of `x << 64`
        m_bits = new_bits; // will be masked at the end of the function
    } else {
        res = m_bits >> -bits_needed; // shift unneeded bits out
    }

    uint64_t mask = (UINT64_C(1) << m_bits_left) - 1; // `m_bits_left` is in range 0..7, so `(1 << 64)` does not have to be considered
    m_bits &= mask;

    return res;
}